

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall lsh::table::erase(table *this,vector *v)

{
  uint uVar1;
  iterator this_00;
  bool bVar2;
  uint uVar3;
  invalid_argument *this_01;
  size_type sVar4;
  reference ppVar5;
  reference this_02;
  reference ppVar6;
  reference puVar7;
  const_iterator local_a0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_98;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  iterator j;
  bucket *b;
  pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *it_1;
  iterator __end2;
  iterator __begin2;
  partition *__range2;
  partition *p;
  uint i;
  pair<const_unsigned_int,_lsh::vector> *it;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_lsh::vector,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>_>
  *__range1;
  uint local_28;
  uint u;
  uint n;
  vector *local_18;
  vector *v_local;
  table *this_local;
  
  uVar1 = this->dimensions_;
  local_18 = v;
  v_local = (vector *)this;
  uVar3 = lsh::vector::size(v);
  if (uVar1 != uVar3) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_01,"Invalid vector size");
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar4 = std::
          vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
          ::size(&this->partitions_);
  local_28 = (uint)sVar4;
  __range1._4_4_ = 0;
  __end1 = std::
           unordered_map<unsigned_int,_lsh::vector,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>_>
           ::begin(&this->vectors_);
  it = (pair<const_unsigned_int,_lsh::vector> *)
       std::
       unordered_map<unsigned_int,_lsh::vector,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>_>
       ::end(&this->vectors_);
  do {
    bVar2 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_lsh::vector>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_lsh::vector>,_false> *)
                        &it);
    if (!bVar2) {
LAB_00161a8d:
      std::
      unordered_map<unsigned_int,_lsh::vector,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>_>
      ::erase(&this->vectors_,(key_type *)((long)&__range1 + 4));
      p._4_4_ = 0;
      do {
        if (local_28 <= p._4_4_) {
          return;
        }
        this_02 = std::
                  vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                  ::operator[](&this->partitions_,(ulong)p._4_4_);
        __end2 = std::
                 unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 ::begin(this_02);
        it_1 = (pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)std::
                  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::end(this_02);
        while (bVar2 = std::__detail::operator!=
                                 (&__end2.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                                  ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                                    *)&it_1), bVar2) {
          ppVar6 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_false>
                   ::operator*(&__end2);
          j._M_current = (uint *)&ppVar6->second;
          local_90._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  j._M_current);
          while( true ) {
            local_98._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(j._M_current)
            ;
            bVar2 = __gnu_cxx::operator!=(&local_90,&local_98);
            if (!bVar2) break;
            puVar7 = __gnu_cxx::
                     __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator*(&local_90);
            this_00 = j;
            if (*puVar7 == __range1._4_4_) {
              __gnu_cxx::
              __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ::__normal_iterator<unsigned_int*>
                        ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          *)&local_a0,&local_90);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00._M_current,
                         local_a0);
              break;
            }
            __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator++(&local_90,0);
          }
          std::__detail::
          _Node_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false,_false>
          ::operator++(&__end2);
        }
        p._4_4_ = p._4_4_ + 1;
      } while( true );
    }
    ppVar5 = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_lsh::vector>,_false,_false>
             ::operator*(&__end1);
    bVar2 = lsh::vector::operator==(&ppVar5->second,local_18);
    if (bVar2) {
      __range1._4_4_ = ppVar5->first;
      goto LAB_00161a8d;
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_lsh::vector>,_false,_false>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void table::erase(const vector& v) {
    if (this->dimensions_ != v.size()) {
      throw std::invalid_argument("Invalid vector size");
    }

    unsigned int n = this->partitions_.size();
    unsigned int u = 0;

    for (const auto& it: this->vectors_) {
      if (it.second == v) {
        u = it.first;
        break;
      }
    }

    this->vectors_.erase(u);

    for (unsigned int i = 0; i < n; i++) {
      partition& p = this->partitions_[i];

      for (auto& it: p) {
        bucket& b = it.second;

        for (auto j = b.begin(); j != b.end(); j++) {
          if (*j == u) {
            b.erase(j);
            break;
          }
        }
      }
    }
  }